

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O3

void __thiscall luna::Lexer::LexSingleLineComment(Lexer *this)

{
  int iVar1;
  
  iVar1 = this->current_;
  while ((0xe < iVar1 + 1U || ((0x4801U >> (iVar1 + 1U & 0x1f) & 1) == 0))) {
    iVar1 = Next(this);
    this->current_ = iVar1;
  }
  return;
}

Assistant:

void Lexer::LexSingleLineComment()
    {
        while (current_ != '\r' && current_ != '\n' && current_ != EOF)
            current_ = Next();
    }